

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  pointer pcVar2;
  sigaction *psVar3;
  size_type sVar4;
  bool bVar5;
  bool skipheader;
  int iVar6;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  sigaction *extraout_RDX;
  undefined8 uVar7;
  sigaction *pipe;
  unsigned_long *puVar8;
  string *psVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  long lVar11;
  allocator local_211;
  bool outputFlags [8];
  string local_208;
  int local_1e4;
  undefined8 local_1e0;
  string local_1d8;
  string subfolder;
  FILE *fout [8];
  sigaction sa;
  string local_b8;
  string local_98;
  string parquetOutFiles [2];
  
  fout[6] = (FILE *)0x0;
  fout[7] = (FILE *)0x0;
  fout[4] = (FILE *)0x0;
  fout[5] = (FILE *)0x0;
  fout[2] = (FILE *)0x0;
  fout[3] = (FILE *)0x0;
  fout[0] = (FILE *)0x0;
  fout[1] = (FILE *)0x0;
  outputFlags[0] = false;
  outputFlags[1] = false;
  outputFlags[2] = false;
  outputFlags[3] = false;
  outputFlags[4] = false;
  outputFlags[5] = false;
  outputFlags[6] = false;
  outputFlags[7] = false;
  parquetOutFiles[0]._M_dataplus._M_p = (pointer)&parquetOutFiles[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)parquetOutFiles,"");
  paVar10 = &parquetOutFiles[1].field_2;
  parquetOutFiles[1]._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)(parquetOutFiles + 1),"");
  subfolder._M_dataplus._M_p = (pointer)&subfolder.field_2;
  subfolder._M_string_length = 0;
  subfolder.field_2._M_local_buf[0] = '\0';
  local_1e0 = 0;
  pipe = (sigaction *)(parquetOutFiles + 1);
  local_1e4 = argc;
  bVar5 = false;
  do {
    while (skipheader = bVar5, iVar6 = getopt(argc,argv,"vhrHF:W:M:S:K:f:w:s:m:"),
          sVar4 = subfolder._M_string_length, psVar3 = _optarg, bVar5 = skipheader, 0x56 < iVar6) {
      if (iVar6 < 0x6d) {
        if (iVar6 == 0x57) {
          std::__cxx11::string::string((string *)&sa,(char *)_optarg,(allocator *)&local_208);
          openpipe(1,(string *)&sa,fout);
          if (sa.__sigaction_handler.sa_handler != (__sighandler_t)(sa.sa_mask.__val + 1)) {
            operator_delete(sa.__sigaction_handler.sa_handler);
          }
          outputFlags[1] = true;
          pipe = &sa;
        }
        else {
          pipe = &sa;
          if (iVar6 != 0x66) {
            if (iVar6 == 0x68) {
              main_cold_1();
            }
            goto switchD_001101eb_caseD_6e;
          }
          std::__cxx11::string::string((string *)pipe,(char *)_optarg,(allocator *)&local_208);
          openpipe(4,(string *)pipe,fout);
          if (sa.__sigaction_handler.sa_handler != (__sighandler_t)(sa.sa_mask.__val + 1)) {
            operator_delete(sa.__sigaction_handler.sa_handler);
          }
          outputFlags[4] = true;
        }
      }
      else {
        if (10 < iVar6 - 0x6dU) goto switchD_001101eb_caseD_6e;
        switch(iVar6) {
        case 0x6d:
          std::__cxx11::string::string((string *)&sa,(char *)_optarg,(allocator *)&local_208);
          openpipe(7,(string *)&sa,fout);
          if (sa.__sigaction_handler.sa_handler != (__sighandler_t)(sa.sa_mask.__val + 1)) {
            operator_delete(sa.__sigaction_handler.sa_handler);
          }
          outputFlags[7] = true;
          pipe = &sa;
          break;
        default:
          goto switchD_001101eb_caseD_6e;
        case 0x72:
          local_1e0 = CONCAT71((int7)((ulong)((long)&switchD_001101eb::switchdataD_0011178c +
                                             (long)(int)(&switchD_001101eb::switchdataD_0011178c)
                                                        [iVar6 - 0x6dU]) >> 8),1);
          break;
        case 0x73:
          std::__cxx11::string::string((string *)&sa,(char *)_optarg,(allocator *)&local_208);
          openpipe(6,(string *)&sa,fout);
          if (sa.__sigaction_handler.sa_handler != (__sighandler_t)(sa.sa_mask.__val + 1)) {
            operator_delete(sa.__sigaction_handler.sa_handler);
          }
          outputFlags[6] = true;
          pipe = &sa;
          break;
        case 0x76:
          goto switchD_001101eb_caseD_76;
        case 0x77:
          std::__cxx11::string::string((string *)&sa,(char *)_optarg,(allocator *)&local_208);
          openpipe(5,(string *)&sa,fout);
          if (sa.__sigaction_handler.sa_handler != (__sighandler_t)(sa.sa_mask.__val + 1)) {
            operator_delete(sa.__sigaction_handler.sa_handler);
          }
          outputFlags[5] = true;
          pipe = &sa;
        }
      }
    }
    bVar5 = true;
    switch(iVar6) {
    case 0x46:
      pipe = &sa;
      std::__cxx11::string::string((string *)pipe,(char *)_optarg,(allocator *)&local_208);
      openpipe(0,(string *)pipe,fout);
      if (sa.__sigaction_handler.sa_handler != (__sighandler_t)(sa.sa_mask.__val + 1)) {
        operator_delete(sa.__sigaction_handler.sa_handler);
      }
      outputFlags[0] = true;
      bVar5 = skipheader;
      break;
    case 0x47:
    case 0x49:
    case 0x4a:
    case 0x4c:
switchD_001101eb_caseD_6e:
      main_cold_5();
switchD_001101eb_caseD_76:
      main_cold_2();
      if ((sigaction *)local_1d8._M_dataplus._M_p != pipe) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      if (local_208._M_dataplus._M_p != "vhrHF:W:M:S:K:f:w:s:m:") {
        operator_delete(local_208._M_dataplus._M_p);
      }
      if ((int)extraout_RDX == 1) {
        main_cold_4();
        uVar7 = extraout_RAX_00;
        if (extraout_RDX != pipe) {
          puVar8 = (unsigned_long *)&pipe[-1].sa_flags;
          do {
            if (puVar8 != (unsigned_long *)puVar8[-2]) {
              operator_delete((undefined1 *)puVar8[-2]);
            }
            psVar9 = (string *)(puVar8 + -2);
            puVar8 = puVar8 + -4;
          } while (psVar9 != parquetOutFiles);
        }
      }
      else {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)subfolder._M_dataplus._M_p != &subfolder.field_2) {
          operator_delete(subfolder._M_dataplus._M_p);
        }
        lVar11 = -0x40;
        do {
          pcVar2 = (((string *)(paVar10 + -1))->_M_dataplus)._M_p;
          if (paVar10 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar2) {
            operator_delete(pcVar2);
          }
          paVar10 = paVar10 + -2;
          lVar11 = lVar11 + 0x20;
          uVar7 = extraout_RAX;
        } while (lVar11 != 0);
      }
      _Unwind_Resume(uVar7);
    case 0x48:
      break;
    case 0x4b:
      strlen((char *)_optarg);
      argc = local_1e4;
      std::__cxx11::string::_M_replace((ulong)&subfolder,0,(char *)sVar4,(ulong)psVar3);
      pipe = psVar3;
      bVar5 = skipheader;
      break;
    case 0x4d:
      std::__cxx11::string::string((string *)&sa,(char *)_optarg,(allocator *)&local_208);
      openpipe(3,(string *)&sa,fout);
      if (sa.__sigaction_handler.sa_handler != (__sighandler_t)(sa.sa_mask.__val + 1)) {
        operator_delete(sa.__sigaction_handler.sa_handler);
      }
      outputFlags[3] = true;
      pipe = &sa;
      bVar5 = skipheader;
      break;
    default:
      if (iVar6 != 0x53) {
        if (iVar6 == -1) {
          if (argc == 1) {
            main_cold_3();
          }
          progname = *argv;
          memset(&sa,0,0x98);
          sigemptyset((sigset_t *)&sa.sa_mask);
          sa.__sigaction_handler.sa_handler = segfault_sigaction;
          sa.sa_flags = 4;
          sigaction(0xb,(sigaction *)&sa,(sigaction *)0x0);
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
          initstreams(&local_98,&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          std::__cxx11::string::string((string *)&local_208,progname,&local_211);
          paVar10 = &local_1d8.field_2;
          local_1d8._M_dataplus._M_p = (pointer)paVar10;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"INFO","");
          logprintf(&local_208,&local_1d8,"starting process..\n");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != paVar10) {
            operator_delete(local_1d8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p);
          }
          leccalc::doit(&subfolder,fout,(bool)((byte)local_1e0 & 1),skipheader,outputFlags,false,
                        parquetOutFiles,progname);
          std::__cxx11::string::string((string *)&local_208,progname,&local_211);
          local_1d8._M_dataplus._M_p = (pointer)paVar10;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"INFO","");
          logprintf(&local_208,&local_1d8,"finishing process..\n");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != paVar10) {
            operator_delete(local_1d8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)subfolder._M_dataplus._M_p != &subfolder.field_2) {
            operator_delete(subfolder._M_dataplus._M_p);
          }
          lVar11 = 0;
          do {
            pcVar1 = *(char **)((long)&parquetOutFiles[1]._M_dataplus._M_p + lVar11);
            if (parquetOutFiles[1].field_2._M_local_buf + lVar11 != pcVar1) {
              operator_delete(pcVar1);
            }
            lVar11 = lVar11 + -0x20;
          } while (lVar11 != -0x40);
          return 0;
        }
        goto switchD_001101eb_caseD_6e;
      }
      std::__cxx11::string::string((string *)&sa,(char *)_optarg,(allocator *)&local_208);
      openpipe(2,(string *)&sa,fout);
      if (sa.__sigaction_handler.sa_handler != (__sighandler_t)(sa.sa_mask.__val + 1)) {
        operator_delete(sa.__sigaction_handler.sa_handler);
      }
      outputFlags[2] = true;
      pipe = &sa;
      bVar5 = skipheader;
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
	bool useReturnPeriodFile = false;
	FILE* fout[] = { nullptr,nullptr,nullptr,nullptr,nullptr,nullptr,nullptr,nullptr };
	bool outputFlags[8] = { false, false, false, false,
				false, false, false, false };
	const bool ordFlag = false;   // Turn off ORD output
	const std::string parquetOutFiles[2] = { "", "" };

	std::string subfolder;
	int opt;
	bool skipheader = false;
	while ((opt = getopt(argc, argv, "vhrHF:W:M:S:K:f:w:s:m:")) != -1) {
		switch (opt) {
		case 'K':
			subfolder = optarg;
			break;
		case 'H':
			skipheader = true;
			break;
		case 'F':
			openpipe(AGG_FULL_UNCERTAINTY, optarg, fout);
			outputFlags[AGG_FULL_UNCERTAINTY] = true;
			break;
		case 'f':
			openpipe(OCC_FULL_UNCERTAINTY, optarg, fout);
			outputFlags[OCC_FULL_UNCERTAINTY] = true;
			break;
		case 'W':
			openpipe(AGG_WHEATSHEAF, optarg, fout);
			outputFlags[AGG_WHEATSHEAF] = true;
			break;
		case 'w':
			openpipe(OCC_WHEATSHEAF, optarg, fout);
			outputFlags[OCC_WHEATSHEAF] = true;
			break;
		case 'S':
			openpipe(AGG_SAMPLE_MEAN, optarg, fout);
			outputFlags[AGG_SAMPLE_MEAN] = true;
			break;
		case 's':
			openpipe(OCC_SAMPLE_MEAN, optarg, fout);
			outputFlags[OCC_SAMPLE_MEAN] = true;
			break;
		case 'M':
			openpipe(AGG_WHEATSHEAF_MEAN, optarg, fout);
			outputFlags[AGG_WHEATSHEAF_MEAN] = true;
			break;
		case 'm':
			openpipe(OCC_WHEATSHEAF_MEAN, optarg, fout);
			outputFlags[OCC_WHEATSHEAF_MEAN] = true;
			break;
		case 'r':
			useReturnPeriodFile = true;
			break;
		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			exit(EXIT_FAILURE);
			break;
		case 'h':
			help();
			::exit(EXIT_FAILURE);
			break;
		default:
			help();
			::exit(EXIT_FAILURE);
		}
	}

	if (argc == 1) {
		fprintf(stderr, "FATAL: Invalid parameters\n");
		help();
	}

	progname = argv[0];
#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif

	try {
		initstreams();
        	logprintf(progname, "INFO", "starting process..\n");
		leccalc::doit(subfolder, fout, useReturnPeriodFile, skipheader,
			      outputFlags, ordFlag, parquetOutFiles, progname);
        	logprintf(progname, "INFO", "finishing process..\n");
		return EXIT_SUCCESS;
	}catch (std::bad_alloc&) {
		fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
		exit(EXIT_FAILURE);
	}
	
}